

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall DiceRoller::DiceRoller(DiceRoller *this)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  int iVar3;
  bool bVar4;
  int local_1c;
  
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->diceRolled = piVar1;
  pvVar2 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  this->history = pvVar2;
  iVar3 = 6;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    local_1c = 0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this->history,&local_1c);
  }
  return;
}

Assistant:

DiceRoller::DiceRoller() : diceRolled(new int(0)), history(new std::vector<int>) {
    for (int x = 0; x < 6; x++) {
        history->push_back(0);
    }
}